

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrPathToString(XrInstance instance,XrPath path,uint32_t bufferCapacityInput,
                       uint32_t *bufferCountOutput,char *buffer)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_44;
  LoaderInstance *pLStack_40;
  XrResult result;
  LoaderInstance *loader_instance;
  char *buffer_local;
  uint32_t *bufferCountOutput_local;
  XrPath XStack_20;
  uint32_t bufferCapacityInput_local;
  XrPath path_local;
  XrInstance instance_local;
  
  loader_instance = (LoaderInstance *)buffer;
  buffer_local = (char *)bufferCountOutput;
  bufferCountOutput_local._4_4_ = bufferCapacityInput;
  XStack_20 = path;
  path_local = (XrPath)instance;
  local_44 = ActiveLoaderInstance::Get(&stack0xffffffffffffffc0,"xrPathToString");
  if (XR_ERROR_VALIDATION_FAILURE < local_44) {
    this = LoaderInstance::DispatchTable(pLStack_40);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_44 = (*pXVar1->PathToString)
                         ((XrInstance)path_local,XStack_20,bufferCountOutput_local._4_4_,
                          (uint32_t *)buffer_local,(char *)loader_instance);
  }
  return local_44;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrPathToString(
    XrInstance                                  instance,
    XrPath                                      path,
    uint32_t                                    bufferCapacityInput,
    uint32_t*                                   bufferCountOutput,
    char*                                       buffer) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrPathToString");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->PathToString(instance, path, bufferCapacityInput, bufferCountOutput, buffer);
    }
    return result;
}